

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall
toml::detail::region::region(region *this,location *loc,const_iterator f,const_iterator l)

{
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__region_001f4e88;
  std::__shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->source_).
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&(loc->source_).
                 super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__cxx11::string::string((string *)&this->source_name_,(string *)&loc->source_name_);
  (this->first_)._M_current = f._M_current;
  (this->last_)._M_current = l._M_current;
  return;
}

Assistant:

region(location&& loc, const_iterator f, const_iterator l)
      : source_(loc.source()), source_name_(loc.name()), first_(f), last_(l)
    {}